

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_2::FileState::Unref(FileState *this)

{
  long lVar1;
  pointer ppcVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    iVar3 = this->refs_;
    this->refs_ = iVar3 + -1;
    if (iVar3 < 1) {
LAB_00d2fb22:
      __assert_fail("refs_ >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/helpers/memenv/memenv.cc"
                    ,0x2f,"void leveldb::(anonymous namespace)::FileState::Unref()");
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    if (iVar3 == 1) {
      Truncate(this);
      ppcVar2 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppcVar2 != (pointer)0x0) {
        operator_delete(ppcVar2,(long)(this->blocks_).
                                      super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage - (long)ppcVar2);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        operator_delete(this,0x78);
        return;
      }
    }
    else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar3);
    goto LAB_00d2fb22;
  }
  __stack_chk_fail();
}

Assistant:

void Unref() {
    bool do_delete = false;

    {
      MutexLock lock(&refs_mutex_);
      --refs_;
      assert(refs_ >= 0);
      if (refs_ <= 0) {
        do_delete = true;
      }
    }

    if (do_delete) {
      delete this;
    }
  }